

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O2

StatT * __thiscall MyGame::Example::Stat::UnPack(Stat *this,resolver_function_t *_resolver)

{
  tuple<MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_> _o_00;
  pointer __p;
  unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_> _o;
  
  _o_00.
  super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>.
  super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>)
       operator_new(0x30);
  *(int64_t *)
   ((long)_o_00.
          super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
          .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)_o_00.
          super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
          .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl + 0x28) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)_o_00.
             super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
             .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl + 0x10))->
  _M_allocated_capacity = 0;
  *(undefined8 *)
   ((long)_o_00.
          super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
          .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl + 0x18) = 0;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)_o_00.
       super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
       .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)_o_00.
                 super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
                 .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl + 0x10);
  *(size_type *)
   ((long)_o_00.
          super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
          .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl + 8) = 0;
  *(int64_t *)
   ((long)_o_00.
          super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
          .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl + 0x20) = 0;
  _o._M_t.
  super___uniq_ptr_impl<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>._M_t.
  super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>.
  super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl =
       (__uniq_ptr_data<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>,_true,_true>
        )(__uniq_ptr_data<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>,_true,_true>
          )_o_00.
           super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
           .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl;
  UnPackTo(this,(StatT *)_o_00.
                         super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
                         .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl,
           _resolver);
  _o._M_t.
  super___uniq_ptr_impl<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>._M_t.
  super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>.
  super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl =
       (__uniq_ptr_data<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>,_true,_true>
        )(__uniq_ptr_impl<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>)0x0;
  std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>::~unique_ptr
            (&_o);
  return (StatT *)(tuple<MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>)
                  _o_00.
                  super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
                  .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl;
}

Assistant:

inline StatT *Stat::UnPack(const ::flatbuffers::resolver_function_t *_resolver) const {
  auto _o = std::unique_ptr<StatT>(new StatT());
  UnPackTo(_o.get(), _resolver);
  return _o.release();
}